

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::DebugNodeTable(ImGuiTable *table)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  int iVar8;
  ImGuiTableColumn *pIVar9;
  bool bVar10;
  bool bVar11;
  byte bVar12;
  int iVar13;
  uint uVar14;
  char *pcVar15;
  ImVec4 *col;
  ImDrawList *pIVar16;
  char *pcVar17;
  ImGuiTableSettings *settings;
  ulong uVar18;
  char *pcVar19;
  char *pcVar20;
  char *pcVar21;
  long lVar22;
  char *pcVar23;
  double dVar24;
  float local_28c;
  ImRect r;
  ImVec2 local_240;
  char buf [512];
  
  iVar8 = table->LastFrameActive;
  iVar13 = GetFrameCount();
  iVar13 = iVar13 + -2;
  pcVar15 = " *Inactive*";
  if (iVar13 <= iVar8) {
    pcVar15 = "";
  }
  ImFormatString(buf,0x200,"Table 0x%08X (%d columns, in \'%s\')%s",(ulong)table->ID,
                 (ulong)(uint)table->ColumnsCount,table->OuterWindow->Name,pcVar15);
  if (iVar8 < iVar13) {
    col = GetStyleColorVec4(1);
    PushStyleColor(0,col);
  }
  bVar10 = TreeNode(table,"%s",buf);
  if (iVar8 < iVar13) {
    PopStyleColor(1);
  }
  bVar11 = IsItemHovered(0);
  if (bVar11) {
    pIVar16 = GetForegroundDrawList();
    ImDrawList::AddRect(pIVar16,&(table->OuterRect).Min,&(table->OuterRect).Max,0xff00ffff,0.0,0xf,
                        1.0);
  }
  bVar11 = IsItemVisible();
  if ((bVar11) && (table->HoveredColumnBody != -1)) {
    pIVar16 = GetForegroundDrawList();
    r.Min = GetItemRectMin();
    local_240 = GetItemRectMax();
    ImDrawList::AddRect(pIVar16,&r.Min,&local_240,0xff00ffff,0.0,0xf,1.0);
  }
  if (bVar10) {
    bVar10 = SmallButton("Clear settings");
    fVar1 = (table->OuterRect).Min.x;
    fVar2 = (table->OuterRect).Min.y;
    uVar14 = (table->Flags & 0xe000U) - 0x2000;
    if (uVar14 < 0x8000) {
      pcVar15 = &DAT_0018817c + *(int *)(&DAT_0018817c + (uVar14 >> 0xb));
    }
    else {
      pcVar15 = "N/A";
    }
    BulletText("OuterRect: Pos: (%.1f,%.1f) Size: (%.1f,%.1f) Sizing: \'%s\'",(double)fVar1,
               (double)fVar2,(double)((table->OuterRect).Max.x - fVar1),
               (double)((table->OuterRect).Max.y - fVar2),pcVar15);
    fVar1 = table->InnerWidth;
    local_28c = 0.0;
    pcVar15 = " (auto)";
    if (fVar1 != 0.0) {
      pcVar15 = "";
    }
    if (NAN(fVar1)) {
      pcVar15 = "";
    }
    BulletText("ColumnsGivenWidth: %.1f, ColumnsAutoFitWidth: %.1f, InnerWidth: %.1f%s",
               (double)table->ColumnsGivenWidth,(double)table->ColumnsAutoFitWidth,(double)fVar1,
               pcVar15);
    BulletText("CellPaddingX: %.1f, CellSpacingX: %.1f/%.1f, OuterPaddingX: %.1f",
               (double)table->CellPaddingX,(double)table->CellSpacingX1,(double)table->CellSpacingX2
               ,(double)table->OuterPaddingX);
    lVar22 = 0;
    BulletText("HoveredColumnBody: %d, HoveredColumnBorder: %d",
               (ulong)(uint)(int)table->HoveredColumnBody,
               (ulong)(uint)(int)table->HoveredColumnBorder);
    BulletText("ResizedColumn: %d, ReorderColumn: %d, HeldHeaderColumn: %d",
               (ulong)(uint)(int)table->ResizedColumn,(ulong)(uint)(int)table->ReorderColumn,
               (ulong)(uint)(int)table->HeldHeaderColumn);
    uVar14 = table->ColumnsCount;
    uVar18 = 0;
    if (0 < (int)uVar14) {
      uVar18 = (ulong)uVar14;
    }
    for (; uVar18 * 0x68 - lVar22 != 0; lVar22 = lVar22 + 0x68) {
      pIVar9 = (table->Columns).Data;
      if ((*(byte *)((long)&pIVar9->Flags + lVar22) & 4) != 0) {
        local_28c = local_28c + *(float *)((long)&pIVar9->StretchWeight + lVar22);
      }
    }
    lVar22 = 100;
    for (uVar18 = 0; (long)uVar18 < (long)(int)uVar14; uVar18 = uVar18 + 1) {
      pIVar9 = (table->Columns).Data;
      pcVar15 = TableGetColumnName(table,(int)uVar18);
      fVar1 = *(float *)((long)pIVar9 + lVar22 + -0x5c);
      fVar2 = (table->WorkRect).Min.x;
      fVar3 = *(float *)((long)pIVar9 + lVar22 + -0x58);
      pcVar19 = "";
      if ((long)uVar18 < (long)table->FreezeColumnsRequest) {
        pcVar19 = " (Frozen)";
      }
      fVar4 = *(float *)((long)pIVar9 + lVar22 + -0x4c);
      if (0.0 < fVar4) {
        dVar24 = (double)((fVar4 / local_28c) * 100.0);
      }
      else {
        dVar24 = 0.0;
      }
      fVar5 = *(float *)((long)pIVar9 + lVar22 + -0x44);
      fVar6 = *(float *)((long)pIVar9 + lVar22 + -0x3c);
      fVar7 = *(float *)((long)pIVar9 + lVar22 + -0x30);
      bVar12 = *(byte *)((long)&pIVar9->Flags + lVar22) & 3;
      pcVar21 = "";
      if (bVar12 == 2) {
        pcVar21 = " (Des)";
      }
      if (bVar12 == 1) {
        pcVar21 = " (Asc)";
      }
      uVar14 = *(uint *)((long)pIVar9 + lVar22 + -100);
      pcVar23 = "WidthStretch ";
      if ((uVar14 & 4) == 0) {
        pcVar23 = "";
      }
      pcVar17 = "WidthFixed ";
      if ((uVar14 & 8) == 0) {
        pcVar17 = "";
      }
      pcVar20 = "NoResize ";
      if ((uVar14 & 0x10) == 0) {
        pcVar20 = "";
      }
      ImFormatString(buf,0x200,
                     "Column %d order %d \'%s\': offset %+.2f to %+.2f%s\nEnabled: %d, VisibleX/Y: %d/%d, RequestOutput: %d, SkipItems: %d, DrawChannels: %d,%d\nWidthGiven: %.1f, Request/Auto: %.1f/%.1f, StretchWeight: %.3f (%.1f%%)\nMinX: %.1f, MaxX: %.1f (%+.1f), ClipRect: %.1f to %.1f (+%.1f)\nContentWidth: %.1f,%.1f, HeadersUsed/Ideal %.1f/%.1f\nSort: %d%s, UserID: 0x%08X, Flags: 0x%04X: %s%s%s.."
                     ,(double)(fVar1 - fVar2),(double)(fVar3 - fVar2),
                     (double)*(float *)((long)pIVar9 + lVar22 + -0x60),
                     (double)*(float *)((long)pIVar9 + lVar22 + -0x54),
                     (double)*(float *)((long)pIVar9 + lVar22 + -0x50),(double)fVar4,dVar24,
                     (double)fVar1,uVar18 & 0xffffffff,
                     (ulong)(uint)(int)*(char *)((long)pIVar9 + lVar22 + -0x12),pcVar15,pcVar19,
                     (uint)*(byte *)((long)pIVar9 + lVar22 + -10),
                     (uint)*(byte *)((long)pIVar9 + lVar22 + -8),
                     (uint)*(byte *)((long)pIVar9 + lVar22 + -7),
                     (uint)*(byte *)((long)pIVar9 + lVar22 + -6),
                     (uint)*(byte *)((long)pIVar9 + lVar22 + -5),
                     (uint)*(byte *)((long)pIVar9 + lVar22 + -0xc),
                     (uint)*(byte *)((long)pIVar9 + lVar22 + -0xb),(double)fVar3,
                     (double)(fVar3 - fVar1),(double)fVar5,(double)fVar6,(double)(fVar6 - fVar5),
                     (double)(*(float *)((long)pIVar9 + lVar22 + -0x24) - fVar7),
                     (double)(*(float *)((long)pIVar9 + lVar22 + -0x20) - fVar7),
                     (double)(*(float *)((long)pIVar9 + lVar22 + -0x1c) - fVar7),
                     (double)(*(float *)((long)pIVar9 + lVar22 + -0x18) - fVar7),
                     (int)*(char *)((long)pIVar9 + lVar22 + -0xe),pcVar21,
                     *(undefined4 *)((long)pIVar9 + lVar22 + -0x34),uVar14,pcVar23,pcVar17,pcVar20);
      Bullet();
      r.Min.x = 0.0;
      r.Min.y = 0.0;
      Selectable(buf,false,0,&r.Min);
      bVar11 = IsItemHovered(0);
      if (bVar11) {
        r.Max.x = *(float *)((long)pIVar9 + lVar22 + -0x58);
        r.Max.y = (table->OuterRect).Max.y;
        r.Min.y = (table->OuterRect).Min.y;
        r.Min.x = *(float *)((long)pIVar9 + lVar22 + -0x5c);
        pIVar16 = GetForegroundDrawList();
        ImDrawList::AddRect(pIVar16,&r.Min,&r.Max,0xff00ffff,0.0,0xf,1.0);
      }
      uVar14 = table->ColumnsCount;
      lVar22 = lVar22 + 0x68;
    }
    settings = TableGetBoundSettings(table);
    if (settings != (ImGuiTableSettings *)0x0) {
      DebugNodeTableSettings(settings);
    }
    if (bVar10) {
      table->IsResetAllRequest = true;
    }
    TreePop();
  }
  return;
}

Assistant:

void ImGui::DebugNodeTable(ImGuiTable* table)
{
    char buf[512];
    char* p = buf;
    const char* buf_end = buf + IM_ARRAYSIZE(buf);
    const bool is_active = (table->LastFrameActive >= ImGui::GetFrameCount() - 2); // Note that fully clipped early out scrolling tables will appear as inactive here.
    ImFormatString(p, buf_end - p, "Table 0x%08X (%d columns, in '%s')%s", table->ID, table->ColumnsCount, table->OuterWindow->Name, is_active ? "" : " *Inactive*");
    if (!is_active) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
    bool open = TreeNode(table, "%s", buf);
    if (!is_active) { PopStyleColor(); }
    if (IsItemHovered())
        GetForegroundDrawList()->AddRect(table->OuterRect.Min, table->OuterRect.Max, IM_COL32(255, 255, 0, 255));
    if (IsItemVisible() && table->HoveredColumnBody != -1)
        GetForegroundDrawList()->AddRect(GetItemRectMin(), GetItemRectMax(), IM_COL32(255, 255, 0, 255));
    if (!open)
        return;
    bool clear_settings = SmallButton("Clear settings");
    BulletText("OuterRect: Pos: (%.1f,%.1f) Size: (%.1f,%.1f) Sizing: '%s'", table->OuterRect.Min.x, table->OuterRect.Min.y, table->OuterRect.GetWidth(), table->OuterRect.GetHeight(), DebugNodeTableGetSizingPolicyDesc(table->Flags));
    BulletText("ColumnsGivenWidth: %.1f, ColumnsAutoFitWidth: %.1f, InnerWidth: %.1f%s", table->ColumnsGivenWidth, table->ColumnsAutoFitWidth, table->InnerWidth, table->InnerWidth == 0.0f ? " (auto)" : "");
    BulletText("CellPaddingX: %.1f, CellSpacingX: %.1f/%.1f, OuterPaddingX: %.1f", table->CellPaddingX, table->CellSpacingX1, table->CellSpacingX2, table->OuterPaddingX);
    BulletText("HoveredColumnBody: %d, HoveredColumnBorder: %d", table->HoveredColumnBody, table->HoveredColumnBorder);
    BulletText("ResizedColumn: %d, ReorderColumn: %d, HeldHeaderColumn: %d", table->ResizedColumn, table->ReorderColumn, table->HeldHeaderColumn);
    //BulletText("BgDrawChannels: %d/%d", 0, table->BgDrawChannelUnfrozen);
    float sum_weights = 0.0f;
    for (int n = 0; n < table->ColumnsCount; n++)
        if (table->Columns[n].Flags & ImGuiTableColumnFlags_WidthStretch)
            sum_weights += table->Columns[n].StretchWeight;
    for (int n = 0; n < table->ColumnsCount; n++)
    {
        ImGuiTableColumn* column = &table->Columns[n];
        const char* name = TableGetColumnName(table, n);
        ImFormatString(buf, IM_ARRAYSIZE(buf),
            "Column %d order %d '%s': offset %+.2f to %+.2f%s\n"
            "Enabled: %d, VisibleX/Y: %d/%d, RequestOutput: %d, SkipItems: %d, DrawChannels: %d,%d\n"
            "WidthGiven: %.1f, Request/Auto: %.1f/%.1f, StretchWeight: %.3f (%.1f%%)\n"
            "MinX: %.1f, MaxX: %.1f (%+.1f), ClipRect: %.1f to %.1f (+%.1f)\n"
            "ContentWidth: %.1f,%.1f, HeadersUsed/Ideal %.1f/%.1f\n"
            "Sort: %d%s, UserID: 0x%08X, Flags: 0x%04X: %s%s%s..",
            n, column->DisplayOrder, name, column->MinX - table->WorkRect.Min.x, column->MaxX - table->WorkRect.Min.x, (n < table->FreezeColumnsRequest) ? " (Frozen)" : "",
            column->IsEnabled, column->IsVisibleX, column->IsVisibleY, column->IsRequestOutput, column->IsSkipItems, column->DrawChannelFrozen, column->DrawChannelUnfrozen,
            column->WidthGiven, column->WidthRequest, column->WidthAuto, column->StretchWeight, column->StretchWeight > 0.0f ? (column->StretchWeight / sum_weights) * 100.0f : 0.0f,
            column->MinX, column->MaxX, column->MaxX - column->MinX, column->ClipRect.Min.x, column->ClipRect.Max.x, column->ClipRect.Max.x - column->ClipRect.Min.x,
            column->ContentMaxXFrozen - column->WorkMinX, column->ContentMaxXUnfrozen - column->WorkMinX, column->ContentMaxXHeadersUsed - column->WorkMinX, column->ContentMaxXHeadersIdeal - column->WorkMinX,
            column->SortOrder, (column->SortDirection == ImGuiSortDirection_Ascending) ? " (Asc)" : (column->SortDirection == ImGuiSortDirection_Descending) ? " (Des)" : "", column->UserID, column->Flags,
            (column->Flags & ImGuiTableColumnFlags_WidthStretch) ? "WidthStretch " : "",
            (column->Flags & ImGuiTableColumnFlags_WidthFixed) ? "WidthFixed " : "",
            (column->Flags & ImGuiTableColumnFlags_NoResize) ? "NoResize " : "");
        Bullet();
        Selectable(buf);
        if (IsItemHovered())
        {
            ImRect r(column->MinX, table->OuterRect.Min.y, column->MaxX, table->OuterRect.Max.y);
            GetForegroundDrawList()->AddRect(r.Min, r.Max, IM_COL32(255, 255, 0, 255));
        }
    }
    if (ImGuiTableSettings* settings = TableGetBoundSettings(table))
        DebugNodeTableSettings(settings);
    if (clear_settings)
        table->IsResetAllRequest = true;
    TreePop();
}